

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

void dumpNodeEdgesToDot(PSNode *node)

{
  PSNode *pPVar1;
  bool bVar2;
  IDType IVar3;
  reference ppPVar4;
  reference ppPVar5;
  long in_RDI;
  PSNode *succ_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range2_1;
  PSNodeRet *R;
  PointerSubgraph *subg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_> *__range2;
  PSNodeCall *C;
  PSNode *op;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  NodesVec *__range1_1;
  PSNode *succ;
  const_iterator __end1;
  const_iterator __begin1;
  NodesVec *__range1;
  IDType in_stack_ffffffffffffff58;
  IDType in_stack_ffffffffffffff5c;
  IDType in_stack_ffffffffffffff60;
  IDType in_stack_ffffffffffffff64;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_88;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *local_80;
  PSNodeRet *local_78;
  PointerSubgraph *local_70;
  PointerSubgraph **local_68;
  __normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
  local_60;
  vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_> *local_58;
  PSNodeCall *local_50;
  PSNode *local_48;
  PSNode **local_40;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_38;
  NodesVec *local_30;
  PSNode *local_28;
  PSNode **local_20;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_18;
  NodesVec *local_10;
  long local_8;
  
  local_8 = in_RDI;
  local_10 = dg::SubgraphNode<dg::pta::PSNode>::successors
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
  local_18._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_20 = (PSNode **)
             std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                       ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)), bVar2
        ) {
    ppPVar5 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppPVar5;
    in_stack_ffffffffffffff64 =
         dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
    IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID
                      ((SubgraphNode<dg::pta::PSNode> *)(local_28 + 8));
    printf("\tNODE%u -> NODE%u [penwidth=2]\n",(ulong)in_stack_ffffffffffffff64,(ulong)IVar3);
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_18);
  }
  local_30 = dg::SubgraphNode<dg::pta::PSNode>::getOperands
                       ((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
  local_38._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_40 = (PSNode **)
             std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                       ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)), bVar2
        ) {
    ppPVar5 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppPVar5;
    in_stack_ffffffffffffff60 =
         dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(local_48 + 8));
    IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8))
    ;
    printf("\tNODE%u -> NODE%u [color=blue,style=dotted,constraint=false]\n",
           (ulong)in_stack_ffffffffffffff60,(ulong)IVar3);
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_38);
  }
  local_50 = dg::pta::PSNodeCall::get
                       ((PSNode *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (local_50 != (PSNodeCall *)0x0) {
    local_58 = dg::pta::PSNodeCall::getCallees(local_50);
    local_60._M_current =
         (PointerSubgraph **)
         std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>::begin
                   ((vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>
                     *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_68 = (PointerSubgraph **)
               std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>
               ::end((vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>
                      *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (__normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
          bVar2) {
      ppPVar4 = __gnu_cxx::
                __normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
                ::operator*(&local_60);
      local_70 = *ppPVar4;
      in_stack_ffffffffffffff5c =
           dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
      IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID
                        ((SubgraphNode<dg::pta::PSNode> *)(*(long *)(local_70 + 0x58) + 8));
      printf("\tNODE%u -> NODE%u [penwidth=4,style=dashed,constraint=false]\n",
             (ulong)in_stack_ffffffffffffff5c,(ulong)IVar3);
      __gnu_cxx::
      __normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
      ::operator++(&local_60);
    }
  }
  local_78 = dg::pta::PSNodeRet::get
                       ((PSNode *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (local_78 != (PSNodeRet *)0x0) {
    local_80 = dg::pta::PSNodeRet::getReturnSites(local_78);
    local_88._M_current =
         (PSNode **)
         std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                   ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
          bVar2) {
      ppPVar5 = __gnu_cxx::
                __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                ::operator*(&local_88);
      pPVar1 = *ppPVar5;
      in_stack_ffffffffffffff58 =
           dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
      IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID
                        ((SubgraphNode<dg::pta::PSNode> *)(pPVar1 + 8));
      printf("\tNODE%u -> NODE%u [penwidth=4,style=dashed,constraint=false]\n",
             (ulong)in_stack_ffffffffffffff58,(ulong)IVar3);
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator++(&local_88);
    }
  }
  return;
}

Assistant:

static void dumpNodeEdgesToDot(PSNode *node) {
    for (PSNode *succ : node->successors()) {
        printf("\tNODE%u -> NODE%u [penwidth=2]\n", node->getID(),
               succ->getID());
    }

    for (PSNode *op : node->getOperands()) {
        printf("\tNODE%u -> NODE%u "
               "[color=blue,style=dotted,constraint=false]\n",
               op->getID(), node->getID());
    }

    if (auto *C = PSNodeCall::get(node)) {
        for (auto *const subg : C->getCallees()) {
            printf("\tNODE%u -> NODE%u "
                   "[penwidth=4,style=dashed,constraint=false]\n",
                   node->getID(), subg->root->getID());
        }
    }

    if (auto *R = PSNodeRet::get(node)) {
        for (auto *const succ : R->getReturnSites()) {
            printf("\tNODE%u -> NODE%u "
                   "[penwidth=4,style=dashed,constraint=false]\n",
                   node->getID(), succ->getID());
        }
    }
}